

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O0

void __thiscall
agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::operator()
          (thread_mapping_blender<unsigned_short,_unsigned_char> *this,unsigned_short *pixels,
          int param_2,int param_3,count_t length,cover_type *covers)

{
  byte bVar1;
  byte bVar2;
  byte *local_30;
  cover_type *covers_local;
  count_t length_local;
  int param_3_local;
  int param_2_local;
  unsigned_short *pixels_local;
  thread_mapping_blender<unsigned_short,_unsigned_char> *this_local;
  
  local_30 = covers;
  _param_3_local = pixels;
  for (covers_local._4_4_ = length; covers_local._4_4_ != 0;
      covers_local._4_4_ = covers_local._4_4_ - 1) {
    bVar1 = *local_30;
    bVar2 = anon_unknown_2::map_thread(this->_mapping,this->_mtx);
    *_param_3_local = (ushort)bVar1 + (ushort)bVar2 * 0x100;
    _param_3_local = _param_3_local + 1;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int /*x*/, int /*y*/, count_t length, const cover_type *covers) const
				{
					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ (map_thread(_mapping, _mtx) << sizeof(cover_type) * 8));
				}